

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::
DoSimdReplace<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,unsigned_int>
          (Thread *this,Instr instr)

{
  Value VVar1;
  Value local_20;
  
  VVar1 = Pop(this);
  local_20 = Pop(this);
  *(short *)((long)&local_20 + (ulong)instr.field_2.imm_u8 * 2) = VVar1._0_2_;
  Push(this,local_20);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdReplace(Instr instr) {
  auto val = Pop<T>();
  auto simd = Pop<R>();
  simd.v[instr.imm_u8] = val;
  Push(simd);
  return RunResult::Ok;
}